

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O0

void __thiscall
pbrt::SPPMIntegrator::SPPMIntegrator
          (SPPMIntegrator *this,CameraHandle *camera,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,int nIterations,
          int photonsPerIteration,int maxDepth,Float initialSearchRadius,bool regularize,int seed,
          RGBColorSpace *colorSpace)

{
  undefined8 *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_stack_00000008;
  byte in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined8 in_stack_00000020;
  CameraHandle *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  CameraHandle *in_stack_ffffffffffffff38;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffff40;
  int local_b4;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__x;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  PrimitiveHandle *in_stack_ffffffffffffffa8;
  Integrator *in_stack_ffffffffffffffb0;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_38 [2];
  
  local_38[0].super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_finish._3_1_ = in_stack_00000010 & 1;
  __x = local_38;
  local_38[0].super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_XMM0_Da;
  local_38[0].super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = in_R9D;
  local_38[0].super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = in_R8D;
  PrimitiveHandle::PrimitiveHandle
            ((PrimitiveHandle *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (PrimitiveHandle *)in_stack_ffffffffffffff28);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             &stack0xffffffffffffffb0,__x);
  Integrator::Integrator
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
            (in_stack_ffffffffffffff40);
  *in_RDI = &PTR__SPPMIntegrator_03748e40;
  CameraHandle::CameraHandle
            ((CameraHandle *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  *(undefined4 *)(in_RDI + 0xc) =
       local_38[0].super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
       .super__Vector_impl_data._M_finish._4_4_;
  *(undefined4 *)((long)in_RDI + 100) = in_stack_00000018;
  *(undefined4 *)(in_RDI + 0xd) =
       local_38[0].super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._4_4_;
  *(byte *)((long)in_RDI + 0x6c) =
       local_38[0].super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
       .super__Vector_impl_data._M_finish._3_1_ & 1;
  *(undefined4 *)(in_RDI + 0xe) = in_stack_00000008;
  if ((int)local_38[0].super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage < 1) {
    CameraHandle::GetFilm(in_stack_ffffffffffffff38);
    FilmHandle::PixelBounds
              ((FilmHandle *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    local_b4 = Bounds2<int>::Area((Bounds2<int> *)
                                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  else {
    local_b4 = (int)local_38[0].
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  *(int *)((long)in_RDI + 0x74) = local_b4;
  in_RDI[0xf] = in_stack_00000020;
  return;
}

Assistant:

SPPMIntegrator(CameraHandle camera, PrimitiveHandle aggregate,
                   std::vector<LightHandle> lights, int nIterations,
                   int photonsPerIteration, int maxDepth, Float initialSearchRadius,
                   bool regularize, int seed, const RGBColorSpace *colorSpace)
        : Integrator(aggregate, lights),
          camera(camera),
          initialSearchRadius(initialSearchRadius),
          nIterations(nIterations),
          maxDepth(maxDepth),
          photonsPerIteration(photonsPerIteration > 0
                                  ? photonsPerIteration
                                  : camera.GetFilm().PixelBounds().Area()),
          regularize(regularize),
          colorSpace(colorSpace),
          digitPermutationsSeed(seed) {}